

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  string *psVar3;
  ulong uVar4;
  cmake *cmakeInstance;
  pointer pcVar5;
  cmGeneratorTarget *this_00;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  reference pbVar8;
  __shared_ptr *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_5;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_330 [8];
  string err;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_2f0;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_2e0;
  key_type *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_4;
  const_iterator __end4_3;
  const_iterator __begin4_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_3;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_2;
  string local_270;
  key_type *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_2;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  cmGeneratorTarget *genTarget;
  string targetName;
  size_t local_200;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  undefined1 local_1d8 [8];
  string_view prefix;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_1b8;
  key_type *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  string *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_a0 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string *val;
  string prop;
  anon_class_16_2_c95d1c49 print_err;
  bool ignoreMissingTarget_local;
  string *executable_local;
  GenVarsT *genVars_local;
  cmQtAutoGenInitializer *this_local;
  
  prop.field_2._8_8_ = this;
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[12]>
            ((string *)&val,&genVars->GenNameUpper,(char (*) [12])0x11288fe);
  psVar3 = cmTarget::GetSafeProperty(this->GenTarget->Target,(string *)&val);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmMakefile::GetBacktrace
              ((cmMakefile *)
               &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmakeInstance = cmMakefile::GetCMakeInstance(this->Makefile);
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&cge,
               (cmListFileBacktrace *)
               &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_a0,cmakeInstance,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    std::__cxx11::string::string((string *)&__range4,(string *)psVar3);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)&stack0xffffffffffffff48,(string *)local_a0);
    std::__cxx11::string::~string((string *)&__range4);
    if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
      pcVar5 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)&stack0xffffffffffffff48);
      pcVar1 = this->LocalGen;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
      std::__cxx11::string::string((string *)&local_160);
      psVar3 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar5,pcVar1,&local_138,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_160
                         );
      std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    else {
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->ConfigsList);
      config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->ConfigsList);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&config), bVar2) {
        local_f8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end4);
        pcVar5 = std::
                 unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                               *)&stack0xffffffffffffff48);
        psVar3 = local_f8;
        pcVar1 = this->LocalGen;
        std::__cxx11::string::string((string *)&local_118);
        psVar3 = cmCompiledGeneratorExpression::Evaluate
                           (pcVar5,pcVar1,psVar3,(cmGeneratorTarget *)0x0,
                            (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                            &local_118);
        pmVar6 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&(genVars->Executable).Config,local_f8);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar3);
        std::__cxx11::string::~string((string *)&local_118);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&stack0xffffffffffffff48);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_a0);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar4 = std::__cxx11::string::empty();
    if ((((uVar4 & 1) == 0) ||
        (bVar2 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::empty(&(genVars->Executable).Config), !bVar2)) || (ignoreMissingTarget)) {
      if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                  (&(genVars->ExecutableFeatures).Default,
                   (shared_ptr<cmQtAutoGen::CompilerFeatures> *)&prefix._M_str);
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                  ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)&prefix._M_str);
      }
      else {
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ConfigsList);
        config_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->ConfigsList);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&config_1), bVar2) {
          local_1a8 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
          pmVar7 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                   ::operator[](&(genVars->ExecutableFeatures).Config,local_1a8);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=(pmVar7,&local_1b8);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_1b8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
      }
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     " evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      this_local._7_1_ = 0;
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&val);
  if (bVar2) goto LAB_004fc2f3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_1d8);
  if ((this->QtVersion).Major == 4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"Qt4::");
    local_1d8 = (undefined1  [8])local_1e8._M_len;
    prefix._M_len = (size_t)local_1e8._M_str;
  }
  else if ((this->QtVersion).Major == 5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f8,"Qt5::");
    local_1d8 = (undefined1  [8])local_1f8._M_len;
    prefix._M_len = (size_t)local_1f8._M_str;
  }
  else if ((this->QtVersion).Major == 6) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&targetName.field_2 + 8),
               "Qt6::");
    local_1d8 = (undefined1  [8])targetName.field_2._8_8_;
    prefix._M_len = local_200;
  }
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&>
            ((string *)&genTarget,(basic_string_view<char,_std::char_traits<char>_> *)local_1d8,
             executable);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGen,(string *)&genTarget);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    if (ignoreMissingTarget) {
      if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                  (&(genVars->ExecutableFeatures).Default,&local_2f0);
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_2f0);
      }
      else {
        __end4_3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->ConfigsList);
        config_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->ConfigsList);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_3,
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&config_4), bVar2) {
          local_2d0 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4_3);
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
          pmVar7 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                   ::operator[](&(genVars->ExecutableFeatures).Config,local_2d0);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=(pmVar7,&local_2e0);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_2e0);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4_3);
        }
      }
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
      cmStrCat<char_const(&)[16],std::__cxx11::string_const&,char_const(&)[20],std::__cxx11::string_const&>
                ((string *)((long)&err.field_2 + 8),(char (*) [16])"Could not find ",executable,
                 (char (*) [20])" executable target ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&genTarget);
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),
                 (string *)((long)&err.field_2 + 8));
      std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      this_local._7_1_ = 0;
      bVar2 = true;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&genVars->ExecutableTargetName,(string *)&genTarget);
    genVars->ExecutableTarget = this_00;
    bVar2 = cmGeneratorTarget::IsImported(this_00);
    if (bVar2) {
      if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
        cmGeneratorTarget::ImportedGetLocation((string *)&__range4_2,this_00,&this->ConfigDefault);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&__range4_2);
        std::__cxx11::string::~string((string *)&__range4_2);
      }
      else {
        __end4_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->ConfigsList);
        config_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->ConfigsList);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&config_2), bVar2) {
          local_250 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4_1);
          cmGeneratorTarget::ImportedGetLocation(&local_270,this_00,local_250);
          pmVar6 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&(genVars->Executable).Config,local_250);
          std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4_1);
        }
      }
    }
    else if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
      psVar3 = cmGeneratorTarget::GetLocation(this_00,&this->ConfigDefault);
      std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)psVar3);
    }
    else {
      __end4_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ConfigsList);
      config_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->ConfigsList);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4_2,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&config_3), bVar2) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end4_2);
        psVar3 = cmGeneratorTarget::GetLocation(this_00,pbVar8);
        pmVar6 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&(genVars->Executable).Config,pbVar8);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar3);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4_2);
      }
    }
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&genTarget);
  if (bVar2) goto LAB_004fc2f3;
  std::__cxx11::string::string((string *)local_330);
  cmQtAutoGenGlobalInitializer::GetCompilerFeatures
            ((ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2,
             this->GlobalInitializer,executable,&genVars->Executable,(string *)local_330,
             (bool)(this->MultiConfig & 1),(bool)(this->UseBetterGraph & 1));
  cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::operator=
            (&genVars->ExecutableFeatures,
             (ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
  cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::~ConfigStrings
            ((ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
  if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&genVars->ExecutableFeatures);
    if (bVar2) goto LAB_004fc2cb;
    GetQtExecutable::anon_class_16_2_c95d1c49::operator()
              ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_330);
    this_local._7_1_ = 0;
    bVar2 = true;
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->ConfigsList);
    config_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->ConfigsList);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config_5), bVar2) {
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      p_Var9 = (__shared_ptr *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
               ::operator[](&(genVars->ExecutableFeatures).Config,pbVar8);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var9);
      if (!bVar2) {
        p_Var9 = (__shared_ptr *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                 ::operator[](&(genVars->ExecutableFeatures).Config,pbVar8);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var9);
        if (!bVar2) {
          GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                    ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_330);
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_004fc2d5;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
LAB_004fc2cb:
    bVar2 = false;
  }
LAB_004fc2d5:
  std::__cxx11::string::~string((string *)local_330);
  if (!bVar2) {
    this_local._7_1_ = 1;
  }
LAB_004fc2f3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    cmSystemTools::Error(cmStrCat(genVars.GenNameUpper, " for target ",
                                  this->GenTarget->GetName(), ": ", err));
  };

  // Custom executable
  {
    std::string const prop = cmStrCat(genVars.GenNameUpper, "_EXECUTABLE");
    std::string const& val = this->GenTarget->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
        cmGeneratorExpression ge(*this->Makefile->GetCMakeInstance(), lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.Executable.Config[config] =
              cge->Evaluate(this->LocalGen, config);
          }
        } else {
          genVars.Executable.Default = cge->Evaluate(this->LocalGen, "");
        }
      }

      if (genVars.Executable.Default.empty() &&
          genVars.Executable.Config.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      if (this->MultiConfig && this->UseBetterGraph) {
        for (auto const& config : this->ConfigsList) {
          genVars.ExecutableFeatures.Config[config] =
            std::make_shared<cmQtAutoGen::CompilerFeatures>();
        }
      } else {
        genVars.ExecutableFeatures.Default =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
      }
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    cm::string_view prefix;
    if (this->QtVersion.Major == 4) {
      prefix = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      prefix = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      prefix = "Qt6::";
    }
    std::string const targetName = cmStrCat(prefix, executable);

    // Find target
    cmGeneratorTarget* genTarget =
      this->LocalGen->FindGeneratorTargetToUse(targetName);
    if (genTarget) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = genTarget;
      if (genTarget->IsImported()) {
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.Executable.Config[config] =
              genTarget->ImportedGetLocation(config);
          }
        } else {
          genVars.Executable.Default =
            genTarget->ImportedGetLocation(this->ConfigDefault);
        }

      } else {
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.Executable.Config[config] = genTarget->GetLocation(config);
          }
        } else {
          genVars.Executable.Default =
            genTarget->GetLocation(this->ConfigDefault);
        }
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.ExecutableFeatures.Config[config] =
              std::make_shared<cmQtAutoGen::CompilerFeatures>();
          }
        } else {
          genVars.ExecutableFeatures.Default =
            std::make_shared<cmQtAutoGen::CompilerFeatures>();
        }

        return true;
      }
      print_err(cmStrCat("Could not find ", executable, " executable target ",
                         targetName));
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err, this->MultiConfig,
      this->UseBetterGraph);
    if (this->MultiConfig && this->UseBetterGraph) {
      for (auto const& config : this->ConfigsList) {
        if (!genVars.ExecutableFeatures.Config[config]) {
          if (!genVars.ExecutableFeatures.Config[config]) {
            print_err(err);
            return false;
          }
        }
      }
    } else {
      if (!genVars.ExecutableFeatures.Default) {
        print_err(err);
        return false;
      }
    }
  }

  return true;
}